

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O3

void __thiscall MIDIplay::describeChannels(MIDIplay *this,char *str,char *attr,size_t size)

{
  uint32_t uVar1;
  uint uVar2;
  OPL3 *pOVar3;
  long lVar4;
  long lVar5;
  byte bVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  ulong uVar6;
  
  if (size != 0 && str != (char *)0x0) {
    pOVar3 = (this->m_synth).m_p;
    uVar1 = pOVar3->m_numChannels;
    if (size == 1 || uVar1 == 0) {
      lVar5 = 0;
    }
    else {
      uVar8 = (ulong)(uVar1 - 1);
      uVar6 = size - 2;
      if (uVar8 <= size - 2) {
        uVar6 = uVar8;
      }
      lVar5 = uVar6 + 1;
      lVar10 = 0x30;
      lVar11 = 0;
      do {
        lVar4 = *(long *)((long)&((this->m_chipChannels).
                                  super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 koff_time_until_neglible_us + lVar10);
        if (*(long *)(lVar4 + 8) == 0) {
          cVar9 = '-';
        }
        else {
          cVar9 = '@';
          if (*(long *)(*(long *)(lVar4 + 8) + 8) == 0) {
            uVar2 = (pOVar3->m_channelCategory).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            cVar9 = 'r';
            if (uVar2 < 3) {
              cVar9 = (char)(0x23232b >> ((byte)(uVar2 << 3) & 0x1f));
            }
          }
        }
        str[lVar11] = cVar9;
        if (*(long *)(lVar4 + 8) == 0) {
          bVar7 = 0;
        }
        else {
          bVar7 = *(byte *)(lVar4 + 0x10) & 0xf;
        }
        attr[lVar11] = bVar7;
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x58;
      } while (lVar5 != lVar11);
    }
    str[lVar5] = '\0';
    attr[lVar5] = '\0';
  }
  return;
}

Assistant:

void MIDIplay::describeChannels(char *str, char *attr, size_t size)
{
    if (!str || size <= 0)
        return;

    Synth &synth = *m_synth;
    uint32_t numChannels = synth.m_numChannels;

    uint32_t index = 0;

    while(index < numChannels && index < size - 1)
    {
        const AdlChannel &adlChannel = m_chipChannels[index];

        AdlChannel::const_users_iterator loc = adlChannel.users.begin();
        AdlChannel::const_users_iterator locnext(loc);

        if(!loc.is_end())
            ++locnext;

        if(loc.is_end())  // off
            str[index] = '-';
        else if(!locnext.is_end())  // arpeggio
            str[index] = '@';
        else  // on
        {
            switch(synth.m_channelCategory[index])
            {
            case Synth::ChanCat_Regular:
                str[index] = '+';
                break;
            case Synth::ChanCat_4op_First:
            case Synth::ChanCat_4op_Second:
                str[index] = '#';
                break;
            default:  // rhythm-mode percussion
                str[index] = 'r';
                break;
            }
        }

        uint8_t attribute = 0;
        if(!loc.is_end())  // 4-bit color index of MIDI channel
            attribute |= (uint8_t)(loc->value.loc.MidCh & 0xF);

        attr[index] = (char)attribute;
        ++index;
    }

    str[index] = 0;
    attr[index] = 0;
}